

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.cpp
# Opt level: O0

void __thiscall
duckdb::ScalarFunction::ScalarFunction
          (ScalarFunction *this,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,scalar_function_t *function,bind_scalar_function_t bind,
          bind_scalar_function_extended_t bind_extended,function_statistics_t statistics,
          init_local_state_t init_local_state,LogicalType *varargs,FunctionStability side_effects,
          FunctionNullHandling null_handling,bind_lambda_function_t bind_lambda)

{
  FunctionNullHandling in_CL;
  bind_lambda_function_t in_RDX;
  FunctionStability in_R8B;
  LogicalType *in_R9;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffe78;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffe80;
  bind_scalar_function_t in_stack_ffffffffffffff58;
  scalar_function_t *in_stack_ffffffffffffff60;
  LogicalType *in_stack_ffffffffffffff68;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  ScalarFunction *in_stack_ffffffffffffff80;
  string local_78 [8];
  bind_scalar_function_extended_t in_stack_ffffffffffffff90;
  function_statistics_t in_stack_ffffffffffffff98;
  init_local_state_t in_stack_ffffffffffffffa0;
  
  ::std::__cxx11::string::string(local_78);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe80,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe78);
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffffe80,(LogicalType *)in_stack_fffffffffffffe78);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffffe80,(LogicalType *)in_stack_fffffffffffffe78);
  ScalarFunction(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_R9
                 ,in_R8B,in_CL,in_RDX);
  LogicalType::~LogicalType((LogicalType *)0x27663d);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x27664a);
  LogicalType::~LogicalType((LogicalType *)0x276657);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x276664);
  ::std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

ScalarFunction::ScalarFunction(vector<LogicalType> arguments, LogicalType return_type, scalar_function_t function,
                               bind_scalar_function_t bind, bind_scalar_function_extended_t bind_extended,
                               function_statistics_t statistics, init_local_state_t init_local_state,
                               LogicalType varargs, FunctionStability side_effects, FunctionNullHandling null_handling,
                               bind_lambda_function_t bind_lambda)
    : ScalarFunction(string(), std::move(arguments), std::move(return_type), std::move(function), bind, bind_extended,
                     statistics, init_local_state, std::move(varargs), side_effects, null_handling, bind_lambda) {
}